

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProvingHelper.cpp
# Opt level: O1

void Saturation::ProvingHelper::runVampire(Problem *prb,Options *opt)

{
  uint uVar1;
  ulong uVar2;
  size_t __i;
  long lVar3;
  Preprocess prepro;
  anon_union_5000_2_650ea050_for_random_device_0 local_13a8;
  
  uVar1 = (opt->_randomSeed).super_OptionValue<unsigned_int>.actualValue;
  uVar2 = (ulong)uVar1;
  if (uVar2 == 0) {
    std::random_device::random_device((random_device *)&local_13a8.field_0);
    ::Lib::Random::_seed = std::random_device::_M_getval();
    uVar2 = (ulong)::Lib::Random::_seed;
    lVar3 = 1;
    ::Lib::Random::_eng._M_x[0] = uVar2;
    do {
      uVar2 = (ulong)(((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar3);
      ::Lib::Random::_eng._M_x[lVar3] = uVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x270);
    ::Lib::Random::_eng._M_p = 0x270;
    std::random_device::_M_fini();
  }
  else {
    lVar3 = 1;
    ::Lib::Random::_seed = uVar1;
    ::Lib::Random::_eng._M_x[0] = uVar2;
    do {
      uVar2 = (ulong)(((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar3);
      ::Lib::Random::_eng._M_x[lVar3] = uVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x270);
    ::Lib::Random::_eng._M_p = 0x270;
  }
  local_13a8._M_mt._M_x[1]._0_2_ = 1;
  local_13a8.field_0._M_file = opt;
  Shell::Preprocess::preprocess((Preprocess *)&local_13a8.field_0,prb);
  runVampireSaturationImpl(prb,opt);
  return;
}

Assistant:

void ProvingHelper::runVampire(Problem& prb, const Options& opt)
{
  // Here officially starts preprocessing of the porfolio mode (separately for each worker)
  // and that's the moment we want to set the random seed
  // (no randomness in parsing, for the peace of mind - parsing was done by the master process!)
  // the main reason being that we want to stay in sync with what vampire mode does
  // cf getPreprocessedProblem in vampire.cpp
  if (opt.randomSeed() != 0) {
    Lib::Random::setSeed(opt.randomSeed());
  } else {
    Lib::Random::resetSeed();
  }

  try
  {
    ClauseIterator clauses;
    {
      TIME_TRACE(TimeTrace::PREPROCESSING);

      Preprocess prepro(opt);
      prepro.preprocess(prb);
    }
    runVampireSaturationImpl(prb, opt);
  }
  catch(const std::bad_alloc &) {
    env.statistics->terminationReason=TerminationReason::MEMORY_LIMIT;
    env.statistics->refutation=0;
  }
  catch(TimeLimitExceededException&) {
    env.statistics->terminationReason=TerminationReason::TIME_LIMIT;
    env.statistics->refutation=0;
  }
  catch(ActivationLimitExceededException&) {
    env.statistics->terminationReason=TerminationReason::ACTIVATION_LIMIT;
    env.statistics->refutation=0;
  }
}